

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

int lws_retry_sul_schedule
              (lws_context *context,int tid,lws_sorted_usec_list_t *sul,lws_retry_bo_t *retry,
              sul_cb_t cb,uint16_t *ctry)

{
  uint uVar1;
  uint64_t ms;
  uint16_t *puStack_40;
  char conceal;
  uint16_t *ctry_local;
  sul_cb_t cb_local;
  lws_retry_bo_t *retry_local;
  lws_sorted_usec_list_t *sul_local;
  lws_context *plStack_18;
  int tid_local;
  lws_context *context_local;
  
  puStack_40 = ctry;
  ctry_local = (uint16_t *)cb;
  cb_local = (sul_cb_t)retry;
  retry_local = (lws_retry_bo_t *)sul;
  sul_local._4_4_ = tid;
  plStack_18 = context;
  uVar1 = lws_retry_get_delay_ms(context,retry,ctry,(char *)((long)&ms + 7));
  if (ms._7_1_ != '\0') {
    _lws_log(8,"%s: sul %p: scheduling retry in %dms\n","lws_retry_sul_schedule",retry_local,
             (ulong)uVar1);
    lws_sul_schedule(plStack_18,sul_local._4_4_,(lws_sorted_usec_list_t *)retry_local,
                     (sul_cb_t)ctry_local,(ulong)uVar1 * 1000);
  }
  context_local._4_4_ = (uint)(ms._7_1_ == '\0');
  return context_local._4_4_;
}

Assistant:

int
lws_retry_sul_schedule(struct lws_context *context, int tid,
		       lws_sorted_usec_list_t *sul,
		       const lws_retry_bo_t *retry, sul_cb_t cb, uint16_t *ctry)
{
	char conceal;
	uint64_t ms = lws_retry_get_delay_ms(context, retry, ctry, &conceal);

	if (!conceal)
		return 1;

	lwsl_info("%s: sul %p: scheduling retry in %dms\n", __func__, sul,
			(int)ms);

	lws_sul_schedule(context, tid, sul, cb, ms * 1000);

	return 0;
}